

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_sse_blend_popcnt_unroll8(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  ulong uVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  byte bVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  long lVar135;
  ulong uVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  
  auVar134 = _DAT_00114070;
  auVar133 = _DAT_00114060;
  uVar124 = (ulong)(len >> 3);
  uVar136 = 0;
  while (uVar1 = uVar136 + 8, uVar1 <= uVar124) {
    lVar135 = 0x20;
    auVar137 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8),auVar133,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 8));
    auVar138 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 8),auVar134,
                                 *(undefined1 (*) [16])(array + uVar136 * 8));
    auVar139 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x10),auVar133,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x18));
    auVar140 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x18),auVar134,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x10));
    auVar141 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x20),auVar133,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x28));
    auVar142 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x28),auVar134,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x20));
    auVar143 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x30),auVar133,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x38));
    auVar144 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x38),auVar134,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x30));
    for (; uVar136 = uVar1, lVar135 != 0; lVar135 = lVar135 + -4) {
      auVar4 = auVar139 >> 7;
      auVar12 = auVar139 >> 0xf;
      auVar20 = auVar139 >> 0x17;
      auVar28 = auVar139 >> 0x1f;
      auVar36 = auVar139 >> 0x27;
      auVar44 = auVar139 >> 0x2f;
      auVar52 = auVar139 >> 0x37;
      auVar60 = auVar139 >> 0x3f;
      auVar68 = auVar139 >> 0x47;
      auVar76 = auVar139 >> 0x4f;
      auVar84 = auVar139 >> 0x57;
      auVar92 = auVar139 >> 0x5f;
      auVar100 = auVar139 >> 0x67;
      auVar108 = auVar139 >> 0x6f;
      auVar116 = auVar139 >> 0x77;
      bVar125 = auVar139[0xf];
      auVar5 = auVar141 >> 7;
      auVar13 = auVar141 >> 0xf;
      auVar21 = auVar141 >> 0x17;
      auVar29 = auVar141 >> 0x1f;
      auVar37 = auVar141 >> 0x27;
      auVar45 = auVar141 >> 0x2f;
      auVar53 = auVar141 >> 0x37;
      auVar61 = auVar141 >> 0x3f;
      auVar69 = auVar141 >> 0x47;
      auVar77 = auVar141 >> 0x4f;
      auVar85 = auVar141 >> 0x57;
      auVar93 = auVar141 >> 0x5f;
      auVar101 = auVar141 >> 0x67;
      auVar109 = auVar141 >> 0x6f;
      auVar117 = auVar141 >> 0x77;
      bVar126 = auVar141[0xf];
      auVar6 = auVar137 >> 7;
      auVar14 = auVar137 >> 0xf;
      auVar22 = auVar137 >> 0x17;
      auVar30 = auVar137 >> 0x1f;
      auVar38 = auVar137 >> 0x27;
      auVar46 = auVar137 >> 0x2f;
      auVar54 = auVar137 >> 0x37;
      auVar62 = auVar137 >> 0x3f;
      auVar70 = auVar137 >> 0x47;
      auVar78 = auVar137 >> 0x4f;
      auVar86 = auVar137 >> 0x57;
      auVar94 = auVar137 >> 0x5f;
      auVar102 = auVar137 >> 0x67;
      auVar110 = auVar137 >> 0x6f;
      auVar118 = auVar137 >> 0x77;
      bVar127 = auVar137[0xf];
      auVar7 = auVar140 >> 7;
      auVar15 = auVar140 >> 0xf;
      auVar23 = auVar140 >> 0x17;
      auVar31 = auVar140 >> 0x1f;
      auVar39 = auVar140 >> 0x27;
      auVar47 = auVar140 >> 0x2f;
      auVar55 = auVar140 >> 0x37;
      auVar63 = auVar140 >> 0x3f;
      auVar71 = auVar140 >> 0x47;
      auVar79 = auVar140 >> 0x4f;
      auVar87 = auVar140 >> 0x57;
      auVar95 = auVar140 >> 0x5f;
      auVar103 = auVar140 >> 0x67;
      auVar111 = auVar140 >> 0x6f;
      auVar119 = auVar140 >> 0x77;
      bVar128 = auVar140[0xf];
      auVar8 = auVar138 >> 7;
      auVar16 = auVar138 >> 0xf;
      auVar24 = auVar138 >> 0x17;
      auVar32 = auVar138 >> 0x1f;
      auVar40 = auVar138 >> 0x27;
      auVar48 = auVar138 >> 0x2f;
      auVar56 = auVar138 >> 0x37;
      auVar64 = auVar138 >> 0x3f;
      auVar72 = auVar138 >> 0x47;
      auVar80 = auVar138 >> 0x4f;
      auVar88 = auVar138 >> 0x57;
      auVar96 = auVar138 >> 0x5f;
      auVar104 = auVar138 >> 0x67;
      auVar112 = auVar138 >> 0x6f;
      auVar120 = auVar138 >> 0x77;
      bVar129 = auVar138[0xf];
      auVar137 = vpaddb_avx(auVar137,auVar137);
      auVar138 = vpaddb_avx(auVar138,auVar138);
      auVar139 = vpaddb_avx(auVar139,auVar139);
      auVar140 = vpaddb_avx(auVar140,auVar140);
      auVar141 = vpaddb_avx(auVar141,auVar141);
      auVar9 = auVar142 >> 7;
      auVar17 = auVar142 >> 0xf;
      auVar25 = auVar142 >> 0x17;
      auVar33 = auVar142 >> 0x1f;
      auVar41 = auVar142 >> 0x27;
      auVar49 = auVar142 >> 0x2f;
      auVar57 = auVar142 >> 0x37;
      auVar65 = auVar142 >> 0x3f;
      auVar73 = auVar142 >> 0x47;
      auVar81 = auVar142 >> 0x4f;
      auVar89 = auVar142 >> 0x57;
      auVar97 = auVar142 >> 0x5f;
      auVar105 = auVar142 >> 0x67;
      auVar113 = auVar142 >> 0x6f;
      auVar121 = auVar142 >> 0x77;
      bVar130 = auVar142[0xf];
      auVar142 = vpaddb_avx(auVar142,auVar142);
      auVar10 = auVar143 >> 7;
      auVar18 = auVar143 >> 0xf;
      auVar26 = auVar143 >> 0x17;
      auVar34 = auVar143 >> 0x1f;
      auVar42 = auVar143 >> 0x27;
      auVar50 = auVar143 >> 0x2f;
      auVar58 = auVar143 >> 0x37;
      auVar66 = auVar143 >> 0x3f;
      auVar74 = auVar143 >> 0x47;
      auVar82 = auVar143 >> 0x4f;
      auVar90 = auVar143 >> 0x57;
      auVar98 = auVar143 >> 0x5f;
      auVar106 = auVar143 >> 0x67;
      auVar114 = auVar143 >> 0x6f;
      auVar122 = auVar143 >> 0x77;
      bVar131 = auVar143[0xf];
      auVar143 = vpaddb_avx(auVar143,auVar143);
      auVar11 = auVar144 >> 7;
      auVar19 = auVar144 >> 0xf;
      auVar27 = auVar144 >> 0x17;
      auVar35 = auVar144 >> 0x1f;
      auVar43 = auVar144 >> 0x27;
      auVar51 = auVar144 >> 0x2f;
      auVar59 = auVar144 >> 0x37;
      auVar67 = auVar144 >> 0x3f;
      auVar75 = auVar144 >> 0x47;
      auVar83 = auVar144 >> 0x4f;
      auVar91 = auVar144 >> 0x57;
      auVar99 = auVar144 >> 0x5f;
      auVar107 = auVar144 >> 0x67;
      auVar115 = auVar144 >> 0x6f;
      auVar123 = auVar144 >> 0x77;
      bVar132 = auVar144[0xf];
      auVar144 = vpaddb_avx(auVar144,auVar144);
      *(int *)((long)flags + lVar135 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar10[0] & 1) | (ushort)(auVar18[0] & 1) << 1 |
                                   (ushort)(auVar26[0] & 1) << 2 | (ushort)(auVar34[0] & 1) << 3 |
                                   (ushort)(auVar42[0] & 1) << 4 | (ushort)(auVar50[0] & 1) << 5 |
                                   (ushort)(auVar58[0] & 1) << 6 | (ushort)(auVar66[0] & 1) << 7 |
                                   (ushort)(auVar74[0] & 1) << 8 | (ushort)(auVar82[0] & 1) << 9 |
                                   (ushort)(auVar90[0] & 1) << 10 | (ushort)(auVar98[0] & 1) << 0xb
                                   | (ushort)(auVar106[0] & 1) << 0xc |
                                   (ushort)(auVar114[0] & 1) << 0xd |
                                   (ushort)(auVar122[0] & 1) << 0xe | (ushort)(bVar131 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar5[0] & 1) | (ushort)(auVar13[0] & 1) << 1 |
                                   (ushort)(auVar21[0] & 1) << 2 | (ushort)(auVar29[0] & 1) << 3 |
                                   (ushort)(auVar37[0] & 1) << 4 | (ushort)(auVar45[0] & 1) << 5 |
                                   (ushort)(auVar53[0] & 1) << 6 | (ushort)(auVar61[0] & 1) << 7 |
                                   (ushort)(auVar69[0] & 1) << 8 | (ushort)(auVar77[0] & 1) << 9 |
                                   (ushort)(auVar85[0] & 1) << 10 | (ushort)(auVar93[0] & 1) << 0xb
                                   | (ushort)(auVar101[0] & 1) << 0xc |
                                   (ushort)(auVar109[0] & 1) << 0xd |
                                   (ushort)(auVar117[0] & 1) << 0xe | (ushort)(bVar126 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar4[0] & 1) | (ushort)(auVar12[0] & 1) << 1 |
                                   (ushort)(auVar20[0] & 1) << 2 | (ushort)(auVar28[0] & 1) << 3 |
                                   (ushort)(auVar36[0] & 1) << 4 | (ushort)(auVar44[0] & 1) << 5 |
                                   (ushort)(auVar52[0] & 1) << 6 | (ushort)(auVar60[0] & 1) << 7 |
                                   (ushort)(auVar68[0] & 1) << 8 | (ushort)(auVar76[0] & 1) << 9 |
                                   (ushort)(auVar84[0] & 1) << 10 | (ushort)(auVar92[0] & 1) << 0xb
                                   | (ushort)(auVar100[0] & 1) << 0xc |
                                   (ushort)(auVar108[0] & 1) << 0xd |
                                   (ushort)(auVar116[0] & 1) << 0xe | (ushort)(bVar125 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar6[0] & 1) | (ushort)(auVar14[0] & 1) << 1 |
                                   (ushort)(auVar22[0] & 1) << 2 | (ushort)(auVar30[0] & 1) << 3 |
                                   (ushort)(auVar38[0] & 1) << 4 | (ushort)(auVar46[0] & 1) << 5 |
                                   (ushort)(auVar54[0] & 1) << 6 | (ushort)(auVar62[0] & 1) << 7 |
                                   (ushort)(auVar70[0] & 1) << 8 | (ushort)(auVar78[0] & 1) << 9 |
                                   (ushort)(auVar86[0] & 1) << 10 | (ushort)(auVar94[0] & 1) << 0xb
                                   | (ushort)(auVar102[0] & 1) << 0xc |
                                   (ushort)(auVar110[0] & 1) << 0xd |
                                   (ushort)(auVar118[0] & 1) << 0xe | (ushort)(bVar127 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar135 + -4);
      *(int *)((long)flags + lVar135 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar11[0] & 1) | (ushort)(auVar19[0] & 1) << 1 |
                                   (ushort)(auVar27[0] & 1) << 2 | (ushort)(auVar35[0] & 1) << 3 |
                                   (ushort)(auVar43[0] & 1) << 4 | (ushort)(auVar51[0] & 1) << 5 |
                                   (ushort)(auVar59[0] & 1) << 6 | (ushort)(auVar67[0] & 1) << 7 |
                                   (ushort)(auVar75[0] & 1) << 8 | (ushort)(auVar83[0] & 1) << 9 |
                                   (ushort)(auVar91[0] & 1) << 10 | (ushort)(auVar99[0] & 1) << 0xb
                                   | (ushort)(auVar107[0] & 1) << 0xc |
                                   (ushort)(auVar115[0] & 1) << 0xd |
                                   (ushort)(auVar123[0] & 1) << 0xe | (ushort)(bVar132 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar9[0] & 1) | (ushort)(auVar17[0] & 1) << 1 |
                                   (ushort)(auVar25[0] & 1) << 2 | (ushort)(auVar33[0] & 1) << 3 |
                                   (ushort)(auVar41[0] & 1) << 4 | (ushort)(auVar49[0] & 1) << 5 |
                                   (ushort)(auVar57[0] & 1) << 6 | (ushort)(auVar65[0] & 1) << 7 |
                                   (ushort)(auVar73[0] & 1) << 8 | (ushort)(auVar81[0] & 1) << 9 |
                                   (ushort)(auVar89[0] & 1) << 10 | (ushort)(auVar97[0] & 1) << 0xb
                                   | (ushort)(auVar105[0] & 1) << 0xc |
                                   (ushort)(auVar113[0] & 1) << 0xd |
                                   (ushort)(auVar121[0] & 1) << 0xe | (ushort)(bVar130 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar7[0] & 1) | (ushort)(auVar15[0] & 1) << 1 |
                                   (ushort)(auVar23[0] & 1) << 2 | (ushort)(auVar31[0] & 1) << 3 |
                                   (ushort)(auVar39[0] & 1) << 4 | (ushort)(auVar47[0] & 1) << 5 |
                                   (ushort)(auVar55[0] & 1) << 6 | (ushort)(auVar63[0] & 1) << 7 |
                                   (ushort)(auVar71[0] & 1) << 8 | (ushort)(auVar79[0] & 1) << 9 |
                                   (ushort)(auVar87[0] & 1) << 10 | (ushort)(auVar95[0] & 1) << 0xb
                                   | (ushort)(auVar103[0] & 1) << 0xc |
                                   (ushort)(auVar111[0] & 1) << 0xd |
                                   (ushort)(auVar119[0] & 1) << 0xe | (ushort)(bVar128 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar8[0] & 1) | (ushort)(auVar16[0] & 1) << 1 |
                                   (ushort)(auVar24[0] & 1) << 2 | (ushort)(auVar32[0] & 1) << 3 |
                                   (ushort)(auVar40[0] & 1) << 4 | (ushort)(auVar48[0] & 1) << 5 |
                                   (ushort)(auVar56[0] & 1) << 6 | (ushort)(auVar64[0] & 1) << 7 |
                                   (ushort)(auVar72[0] & 1) << 8 | (ushort)(auVar80[0] & 1) << 9 |
                                   (ushort)(auVar88[0] & 1) << 10 | (ushort)(auVar96[0] & 1) << 0xb
                                   | (ushort)(auVar104[0] & 1) << 0xc |
                                   (ushort)(auVar112[0] & 1) << 0xd |
                                   (ushort)(auVar120[0] & 1) << 0xe | (ushort)(bVar129 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar135 + 0x1c);
    }
  }
  while (uVar1 = uVar136 + 4, uVar1 <= uVar124) {
    lVar135 = 0x20;
    auVar137 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8),auVar133,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 8));
    auVar138 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 8),auVar134,
                                 *(undefined1 (*) [16])(array + uVar136 * 8));
    auVar139 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x10),auVar133,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x18));
    auVar140 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 0x18),auVar134,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 0x10));
    for (; uVar136 = uVar1, lVar135 != 0; lVar135 = lVar135 + -4) {
      auVar141 = auVar137 >> 7;
      auVar4 = auVar137 >> 0xf;
      auVar8 = auVar137 >> 0x17;
      auVar12 = auVar137 >> 0x1f;
      auVar16 = auVar137 >> 0x27;
      auVar20 = auVar137 >> 0x2f;
      auVar24 = auVar137 >> 0x37;
      auVar28 = auVar137 >> 0x3f;
      auVar32 = auVar137 >> 0x47;
      auVar36 = auVar137 >> 0x4f;
      auVar40 = auVar137 >> 0x57;
      auVar44 = auVar137 >> 0x5f;
      auVar48 = auVar137 >> 0x67;
      auVar52 = auVar137 >> 0x6f;
      auVar56 = auVar137 >> 0x77;
      bVar125 = auVar137[0xf];
      auVar142 = auVar138 >> 7;
      auVar5 = auVar138 >> 0xf;
      auVar9 = auVar138 >> 0x17;
      auVar13 = auVar138 >> 0x1f;
      auVar17 = auVar138 >> 0x27;
      auVar21 = auVar138 >> 0x2f;
      auVar25 = auVar138 >> 0x37;
      auVar29 = auVar138 >> 0x3f;
      auVar33 = auVar138 >> 0x47;
      auVar37 = auVar138 >> 0x4f;
      auVar41 = auVar138 >> 0x57;
      auVar45 = auVar138 >> 0x5f;
      auVar49 = auVar138 >> 0x67;
      auVar53 = auVar138 >> 0x6f;
      auVar57 = auVar138 >> 0x77;
      bVar126 = auVar138[0xf];
      auVar143 = auVar139 >> 7;
      auVar6 = auVar139 >> 0xf;
      auVar10 = auVar139 >> 0x17;
      auVar14 = auVar139 >> 0x1f;
      auVar18 = auVar139 >> 0x27;
      auVar22 = auVar139 >> 0x2f;
      auVar26 = auVar139 >> 0x37;
      auVar30 = auVar139 >> 0x3f;
      auVar34 = auVar139 >> 0x47;
      auVar38 = auVar139 >> 0x4f;
      auVar42 = auVar139 >> 0x57;
      auVar46 = auVar139 >> 0x5f;
      auVar50 = auVar139 >> 0x67;
      auVar54 = auVar139 >> 0x6f;
      auVar58 = auVar139 >> 0x77;
      bVar127 = auVar139[0xf];
      auVar137 = vpaddb_avx(auVar137,auVar137);
      auVar138 = vpaddb_avx(auVar138,auVar138);
      auVar139 = vpaddb_avx(auVar139,auVar139);
      auVar144 = auVar140 >> 7;
      auVar7 = auVar140 >> 0xf;
      auVar11 = auVar140 >> 0x17;
      auVar15 = auVar140 >> 0x1f;
      auVar19 = auVar140 >> 0x27;
      auVar23 = auVar140 >> 0x2f;
      auVar27 = auVar140 >> 0x37;
      auVar31 = auVar140 >> 0x3f;
      auVar35 = auVar140 >> 0x47;
      auVar39 = auVar140 >> 0x4f;
      auVar43 = auVar140 >> 0x57;
      auVar47 = auVar140 >> 0x5f;
      auVar51 = auVar140 >> 0x67;
      auVar55 = auVar140 >> 0x6f;
      auVar59 = auVar140 >> 0x77;
      bVar128 = auVar140[0xf];
      auVar140 = vpaddb_avx(auVar140,auVar140);
      *(int *)((long)flags + lVar135 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar143[0] & 1) | (ushort)(auVar6[0] & 1) << 1 |
                                   (ushort)(auVar10[0] & 1) << 2 | (ushort)(auVar14[0] & 1) << 3 |
                                   (ushort)(auVar18[0] & 1) << 4 | (ushort)(auVar22[0] & 1) << 5 |
                                   (ushort)(auVar26[0] & 1) << 6 | (ushort)(auVar30[0] & 1) << 7 |
                                   (ushort)(auVar34[0] & 1) << 8 | (ushort)(auVar38[0] & 1) << 9 |
                                   (ushort)(auVar42[0] & 1) << 10 | (ushort)(auVar46[0] & 1) << 0xb
                                   | (ushort)(auVar50[0] & 1) << 0xc |
                                   (ushort)(auVar54[0] & 1) << 0xd | (ushort)(auVar58[0] & 1) << 0xe
                                  | (ushort)(bVar127 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar141[0] & 1) | (ushort)(auVar4[0] & 1) << 1 |
                                   (ushort)(auVar8[0] & 1) << 2 | (ushort)(auVar12[0] & 1) << 3 |
                                   (ushort)(auVar16[0] & 1) << 4 | (ushort)(auVar20[0] & 1) << 5 |
                                   (ushort)(auVar24[0] & 1) << 6 | (ushort)(auVar28[0] & 1) << 7 |
                                   (ushort)(auVar32[0] & 1) << 8 | (ushort)(auVar36[0] & 1) << 9 |
                                   (ushort)(auVar40[0] & 1) << 10 | (ushort)(auVar44[0] & 1) << 0xb
                                   | (ushort)(auVar48[0] & 1) << 0xc |
                                   (ushort)(auVar52[0] & 1) << 0xd | (ushort)(auVar56[0] & 1) << 0xe
                                  | (ushort)(bVar125 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar135 + -4);
      *(int *)((long)flags + lVar135 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar144[0] & 1) | (ushort)(auVar7[0] & 1) << 1 |
                                   (ushort)(auVar11[0] & 1) << 2 | (ushort)(auVar15[0] & 1) << 3 |
                                   (ushort)(auVar19[0] & 1) << 4 | (ushort)(auVar23[0] & 1) << 5 |
                                   (ushort)(auVar27[0] & 1) << 6 | (ushort)(auVar31[0] & 1) << 7 |
                                   (ushort)(auVar35[0] & 1) << 8 | (ushort)(auVar39[0] & 1) << 9 |
                                   (ushort)(auVar43[0] & 1) << 10 | (ushort)(auVar47[0] & 1) << 0xb
                                   | (ushort)(auVar51[0] & 1) << 0xc |
                                   (ushort)(auVar55[0] & 1) << 0xd | (ushort)(auVar59[0] & 1) << 0xe
                                  | (ushort)(bVar128 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar142[0] & 1) | (ushort)(auVar5[0] & 1) << 1 |
                                   (ushort)(auVar9[0] & 1) << 2 | (ushort)(auVar13[0] & 1) << 3 |
                                   (ushort)(auVar17[0] & 1) << 4 | (ushort)(auVar21[0] & 1) << 5 |
                                   (ushort)(auVar25[0] & 1) << 6 | (ushort)(auVar29[0] & 1) << 7 |
                                   (ushort)(auVar33[0] & 1) << 8 | (ushort)(auVar37[0] & 1) << 9 |
                                   (ushort)(auVar41[0] & 1) << 10 | (ushort)(auVar45[0] & 1) << 0xb
                                   | (ushort)(auVar49[0] & 1) << 0xc |
                                   (ushort)(auVar53[0] & 1) << 0xd | (ushort)(auVar57[0] & 1) << 0xe
                                  | (ushort)(bVar126 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar135 + 0x1c);
    }
  }
  while (uVar1 = uVar136 + 2, uVar1 <= uVar124) {
    lVar135 = 0x20;
    auVar137 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8),auVar133,
                                 *(undefined1 (*) [16])(array + uVar136 * 8 + 8));
    auVar138 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar136 * 8 + 8),auVar134,
                                 *(undefined1 (*) [16])(array + uVar136 * 8));
    for (; uVar136 = uVar1, lVar135 != 0; lVar135 = lVar135 + -4) {
      auVar139 = auVar137 >> 7;
      auVar140 = auVar137 >> 0xf;
      auVar141 = auVar137 >> 0x17;
      auVar142 = auVar137 >> 0x1f;
      auVar143 = auVar137 >> 0x27;
      auVar144 = auVar137 >> 0x2f;
      auVar4 = auVar137 >> 0x37;
      auVar5 = auVar137 >> 0x3f;
      auVar6 = auVar137 >> 0x47;
      auVar7 = auVar137 >> 0x4f;
      auVar8 = auVar137 >> 0x57;
      auVar9 = auVar137 >> 0x5f;
      auVar10 = auVar137 >> 0x67;
      auVar11 = auVar137 >> 0x6f;
      auVar12 = auVar137 >> 0x77;
      bVar125 = auVar137[0xf];
      auVar137 = vpaddb_avx(auVar137,auVar137);
      piVar2 = (int *)((long)flags + lVar135 + -4);
      *piVar2 = *piVar2 + POPCOUNT((uint)(ushort)((ushort)(auVar139[0] & 1) |
                                                  (ushort)(auVar140[0] & 1) << 1 |
                                                  (ushort)(auVar141[0] & 1) << 2 |
                                                  (ushort)(auVar142[0] & 1) << 3 |
                                                  (ushort)(auVar143[0] & 1) << 4 |
                                                  (ushort)(auVar144[0] & 1) << 5 |
                                                  (ushort)(auVar4[0] & 1) << 6 |
                                                  (ushort)(auVar5[0] & 1) << 7 |
                                                  (ushort)(auVar6[0] & 1) << 8 |
                                                  (ushort)(auVar7[0] & 1) << 9 |
                                                  (ushort)(auVar8[0] & 1) << 10 |
                                                  (ushort)(auVar9[0] & 1) << 0xb |
                                                  (ushort)(auVar10[0] & 1) << 0xc |
                                                  (ushort)(auVar11[0] & 1) << 0xd |
                                                  (ushort)(auVar12[0] & 1) << 0xe |
                                                 (ushort)(bVar125 >> 7) << 0xf));
      auVar139 = auVar138 >> 7;
      auVar140 = auVar138 >> 0xf;
      auVar141 = auVar138 >> 0x17;
      auVar142 = auVar138 >> 0x1f;
      auVar143 = auVar138 >> 0x27;
      auVar144 = auVar138 >> 0x2f;
      auVar4 = auVar138 >> 0x37;
      auVar5 = auVar138 >> 0x3f;
      auVar6 = auVar138 >> 0x47;
      auVar7 = auVar138 >> 0x4f;
      auVar8 = auVar138 >> 0x57;
      auVar9 = auVar138 >> 0x5f;
      auVar10 = auVar138 >> 0x67;
      auVar11 = auVar138 >> 0x6f;
      auVar12 = auVar138 >> 0x77;
      bVar125 = auVar138[0xf];
      auVar138 = vpaddb_avx(auVar138,auVar138);
      piVar2 = (int *)((long)flags + lVar135 + 0x1c);
      *piVar2 = *piVar2 + POPCOUNT((uint)(ushort)((ushort)(auVar139[0] & 1) |
                                                  (ushort)(auVar140[0] & 1) << 1 |
                                                  (ushort)(auVar141[0] & 1) << 2 |
                                                  (ushort)(auVar142[0] & 1) << 3 |
                                                  (ushort)(auVar143[0] & 1) << 4 |
                                                  (ushort)(auVar144[0] & 1) << 5 |
                                                  (ushort)(auVar4[0] & 1) << 6 |
                                                  (ushort)(auVar5[0] & 1) << 7 |
                                                  (ushort)(auVar6[0] & 1) << 8 |
                                                  (ushort)(auVar7[0] & 1) << 9 |
                                                  (ushort)(auVar8[0] & 1) << 10 |
                                                  (ushort)(auVar9[0] & 1) << 0xb |
                                                  (ushort)(auVar10[0] & 1) << 0xc |
                                                  (ushort)(auVar11[0] & 1) << 0xd |
                                                  (ushort)(auVar12[0] & 1) << 0xe |
                                                 (ushort)(bVar125 >> 7) << 0xf));
    }
  }
  for (uVar136 = uVar136 << 3; uVar136 < len; uVar136 = uVar136 + 1) {
    uVar3 = array[uVar136];
    for (lVar135 = 0; lVar135 != 0x10; lVar135 = lVar135 + 1) {
      flags[lVar135] = flags[lVar135] + (uint)((uVar3 >> ((uint)lVar135 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll8(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m128i v##p = _mm_loadu_si128(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3) U(4,5) U(6,7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4,5) A(6, 7)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    return 0;
}